

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_same(REF_INT n,REF_INT *list0,REF_INT *list1,REF_BOOL *same)

{
  uint uVar1;
  REF_INT *unique;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_INT *unique1;
  REF_INT *pRStack_38;
  REF_INT n1;
  REF_INT *unique0;
  REF_BOOL *pRStack_28;
  REF_INT n0;
  REF_BOOL *same_local;
  REF_INT *list1_local;
  REF_INT *list0_local;
  REF_INT n_local;
  
  *same = 0;
  pRStack_28 = same;
  same_local = list1;
  list1_local = list0;
  list0_local._0_4_ = n;
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",0xee,
           "ref_sort_same","malloc unique0 of REF_INT negative");
    list0_local._4_4_ = 1;
  }
  else {
    pRStack_38 = (REF_INT *)malloc((long)n << 2);
    if (pRStack_38 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",0xee,
             "ref_sort_same","malloc unique0 of REF_INT NULL");
      list0_local._4_4_ = 2;
    }
    else if ((REF_INT)list0_local < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",0xef,
             "ref_sort_same","malloc unique1 of REF_INT negative");
      list0_local._4_4_ = 1;
    }
    else {
      unique = (REF_INT *)malloc((long)(REF_INT)list0_local << 2);
      if (unique == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",0xef
               ,"ref_sort_same","malloc unique1 of REF_INT NULL");
        list0_local._4_4_ = 2;
      }
      else {
        uVar1 = ref_sort_unique_int((REF_INT)list0_local,list1_local,(REF_INT *)((long)&unique0 + 4)
                                    ,pRStack_38);
        if (uVar1 == 0) {
          uVar1 = ref_sort_unique_int((REF_INT)list0_local,same_local,
                                      (REF_INT *)((long)&unique1 + 4),unique);
          if (uVar1 == 0) {
            if (unique0._4_4_ == unique1._4_4_) {
              *pRStack_28 = 1;
              for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < unique0._4_4_;
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                if (pRStack_38[ref_private_macro_code_rss_1] != unique[ref_private_macro_code_rss_1]
                   ) {
                  *pRStack_28 = 0;
                  break;
                }
              }
            }
            if (unique != (REF_INT *)0x0) {
              free(unique);
            }
            if (pRStack_38 != (REF_INT *)0x0) {
              free(pRStack_38);
            }
            list0_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",
                   0xf1,"ref_sort_same",(ulong)uVar1,"uniq1");
            list0_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",
                 0xf0,"ref_sort_same",(ulong)uVar1,"uniq0");
          list0_local._4_4_ = uVar1;
        }
      }
    }
  }
  return list0_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_sort_same(REF_INT n, REF_INT *list0, REF_INT *list1,
                                 REF_BOOL *same) {
  REF_INT n0, *unique0;
  REF_INT n1, *unique1;
  REF_INT i;
  *same = REF_FALSE;
  ref_malloc(unique0, n, REF_INT);
  ref_malloc(unique1, n, REF_INT);
  RSS(ref_sort_unique_int(n, list0, &n0, unique0), "uniq0");
  RSS(ref_sort_unique_int(n, list1, &n1, unique1), "uniq1");
  if (n0 == n1) {
    *same = REF_TRUE;
    for (i = 0; i < n0; i++) {
      if (unique0[i] != unique1[i]) {
        *same = REF_FALSE;
        break;
      }
    }
  }
  ref_free(unique1);
  ref_free(unique0);
  return REF_SUCCESS;
}